

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCore.c
# Opt level: O1

void Cec_ManCorSetDefaultParams(Cec_ParCor_t *p)

{
  p->nWords = 0;
  p->nRounds = 0;
  p->nFrames = 0;
  p->nPrefix = 0;
  p->fConstCorr = 0;
  p->fUseRings = 0;
  p->fMakeChoices = 0;
  p->fUseCSat = 0;
  p->fUseSmartCnf = 0;
  p->fStopWhenGone = 0;
  p->fVerboseFlops = 0;
  p->fVeryVerbose = 0;
  *(undefined8 *)&p->fVerbose = 0;
  p->pData = (void *)0x0;
  p->pFunc = (void *)0x0;
  p->nWords = 0xf;
  p->nRounds = 0xf;
  p->nFrames = 1;
  p->nBTLimit = 100;
  p->nLevelMax = -1;
  p->nStepsMax = -1;
  p->fLatchCorr = 0;
  p->fConstCorr = 0;
  p->fUseRings = 1;
  p->fUseCSat = 1;
  p->fUseSmartCnf = 0;
  p->fVeryVerbose = 0;
  p->fVerbose = 0;
  return;
}

Assistant:

void Cec_ManCorSetDefaultParams( Cec_ParCor_t * p )
{
    memset( p, 0, sizeof(Cec_ParCor_t) );
    p->nWords         =      15;  // the number of simulation words
    p->nRounds        =      15;  // the number of simulation rounds
    p->nFrames        =       1;  // the number of time frames
    p->nBTLimit       =     100;  // conflict limit at a node
    p->nLevelMax      =      -1;  // (scorr only) the max number of levels
    p->nStepsMax      =      -1;  // (scorr only) the max number of induction steps
    p->fLatchCorr     =       0;  // consider only latch outputs
    p->fConstCorr     =       0;  // consider only constants
    p->fUseRings      =       1;  // combine classes into rings
    p->fUseCSat       =       1;  // use circuit-based solver
//    p->fFirstStop     =       0;  // stop on the first sat output
    p->fUseSmartCnf   =       0;  // use smart CNF computation
    p->fVeryVerbose   =       0;  // verbose stats
    p->fVerbose       =       0;  // verbose stats
}